

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_alloc.c
# Opt level: O3

void small_alloc_test(int size_min,int size_max,int objects_max,int oscillation_max,
                     int iterations_max)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  int *piVar4;
  ulong uVar5;
  uint uVar6;
  slab_cache *totals_00;
  small_alloc *psVar7;
  long lVar8;
  slab_cache *psVar9;
  long lVar10;
  undefined1 local_68 [8];
  small_stats totals;
  rlist *prStack_50;
  float actual_alloc_factor;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  
  psVar7 = &alloc;
  totals_00 = &cache;
  local_48 = objects_max;
  local_3c = oscillation_max;
  local_34 = size_max;
  small_alloc_create(&alloc,&cache,0xc,8,1.3,(float *)((long)&totals.total + 4));
  local_38 = iterations_max;
  if (0 < iterations_max) {
    local_44 = local_34 - size_min;
    iVar1 = 0;
    do {
      local_40 = iVar1;
      iVar1 = rand();
      uVar5 = (long)iVar1 % (long)local_3c & 0xffffffff;
      if (0 < (int)((long)iVar1 % (long)local_3c)) {
        do {
          iVar1 = rand();
          iVar1 = iVar1 % local_48;
          if (local_34 <= size_min) {
LAB_001032a0:
            __assert_fail("size_max > size_min",
                          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/small_alloc.c"
                          ,0x28,"void *alloc_checked(int, int, int)");
          }
          iVar2 = rand();
          iVar2 = iVar2 % local_44;
          totals_00 = (slab_cache *)ptrs[iVar1];
          if (totals_00 != (slab_cache *)0x0) {
            if (*(int *)&totals_00->arena != iVar1) {
              __assert_fail("ptrs[pos][0] == pos",
                            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/small_alloc.c"
                            ,0x2c,"void *alloc_checked(int, int, int)");
            }
            if ((999 < iVar1) ||
               (uVar3 = (ulong)*(int *)((long)&totals_00->arena + 4),
               *(int *)((long)totals_00->orders + ((uVar3 & 0xfffffffffffffffc) - 0x34)) != iVar1))
            {
              small_alloc_test_cold_1();
              goto LAB_001032a0;
            }
            *(undefined4 *)((long)totals_00->orders + ((uVar3 & 0xfffffffffffffffc) - 0x34)) =
                 0x7fffffff;
            *(undefined4 *)&totals_00->arena = 0x7fffffff;
            psVar7 = &alloc;
            smfree(&alloc,totals_00,(long)*(int *)((long)&totals_00->arena + 4));
            ptrs[iVar1] = (int *)0x0;
          }
          if (allocating == true) {
            iVar2 = iVar2 + size_min;
            psVar9 = (slab_cache *)(long)iVar2;
            psVar7 = &alloc;
            totals_00 = psVar9;
            piVar4 = (int *)smalloc(&alloc,(size_t)psVar9);
            if (piVar4 == (int *)0x0) {
              small_alloc_test_cold_6();
              goto LAB_001032e3;
            }
            ptrs[iVar1] = piVar4;
            *piVar4 = iVar1;
            piVar4[1] = iVar2;
            *(int *)((long)piVar4 + (((ulong)psVar9 & 0xfffffffffffffffc) - 4)) = iVar1;
          }
          uVar6 = (int)uVar5 - 1;
          uVar5 = (ulong)uVar6;
        } while (uVar6 != 0);
      }
      allocating = (_Bool)(allocating ^ 1);
      iVar1 = local_40 + 1;
    } while (iVar1 != local_38);
  }
  lVar10 = 0;
  do {
    psVar9 = *(slab_cache **)((long)ptrs + lVar10);
    if (psVar9 != (slab_cache *)0x0) {
      lVar8 = (long)*(int *)&psVar9->arena;
      if ((999 < lVar8) ||
         (uVar5 = (ulong)*(int *)((long)&psVar9->arena + 4),
         *(int *)((long)psVar9->orders + ((uVar5 & 0xfffffffffffffffc) - 0x34)) !=
         *(int *)&psVar9->arena)) goto LAB_001032e3;
      totals_00 = (slab_cache *)ptrs[lVar8];
      if (totals_00 != psVar9) goto LAB_001032e8;
      *(undefined4 *)((long)totals_00->orders + ((uVar5 & 0xfffffffffffffffc) - 0x34)) = 0x7fffffff;
      *(undefined4 *)&totals_00->arena = 0x7fffffff;
      psVar7 = &alloc;
      smfree(&alloc,totals_00,(long)*(int *)((long)&totals_00->arena + 4));
      ptrs[lVar8] = (int *)0x0;
    }
    lVar10 = lVar10 + 8;
  } while (lVar10 != 8000);
  prStack_50 = (rlist *)0x0;
  psVar7 = &alloc;
  totals_00 = (slab_cache *)local_68;
  small_stats(&alloc,(small_stats *)totals_00,small_is_unused_cb,&stack0xffffffffffffffb0);
  if (local_68 == (undefined1  [8])0x0) {
    if (cache.allocated.stats.used <= prStack_50) {
      small_alloc_destroy(&alloc);
      return;
    }
    goto LAB_001032f2;
  }
LAB_001032ed:
  small_alloc_test_cold_4();
LAB_001032f2:
  small_alloc_test_cold_5();
  totals_00->arena =
       (slab_arena *)
       ((long)&(totals_00->arena->cache).next +
       (ulong)(uint)(*(int *)((long)&psVar7->small_mempool_cache[0].pool.cache + 4) *
                    *(int *)&psVar7->small_mempool_cache[0].pool.cache));
  return;
LAB_001032e3:
  small_alloc_test_cold_2();
LAB_001032e8:
  small_alloc_test_cold_3();
  goto LAB_001032ed;
}

Assistant:

static void
small_alloc_test(int size_min, int size_max, int objects_max,
		 int oscillation_max, int iterations_max)
{
	float actual_alloc_factor;
	small_alloc_create(&alloc, &cache, OBJSIZE_MIN,
			   sizeof(intptr_t), 1.3,
			   &actual_alloc_factor);

	for (int i = 0; i < iterations_max; i++) {
		int oscillation = rand() % oscillation_max;
		for (int j = 0; j < oscillation; ++j) {
			int pos = rand() % objects_max;
			alloc_checked(pos, size_min, size_max);
		}
		allocating = ! allocating;
	}

	for (int pos = 0; pos < OBJECTS_MAX; pos++) {
		if (ptrs[pos] != NULL)
			free_checked(ptrs[pos]);
	}

	small_check_unused();

	small_alloc_destroy(&alloc);
}